

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O2

void sei_cat(sei_t *to,sei_t *from,int itu_t_t35)

{
  sei_message_t *psVar1;
  sei_message_t *psVar2;
  sei_message_t **ppsVar3;
  
  if (from != (sei_t *)0x0 && to != (sei_t *)0x0) {
    ppsVar3 = &from->head;
    while (psVar1 = *ppsVar3, psVar1 != (sei_message_t *)0x0) {
      if ((itu_t_t35 != 0) || (psVar1->type != sei_type_user_data_registered_itu_t_t35)) {
        psVar2 = sei_message_new(psVar1->type,(uint8_t *)(psVar1 + 1),psVar1->size);
        ppsVar3 = &to->head;
        if (to->head != (sei_message_t *)0x0) {
          ppsVar3 = &to->tail->next;
        }
        *ppsVar3 = psVar2;
        to->tail = psVar2;
      }
      ppsVar3 = &psVar1->next;
    }
  }
  return;
}

Assistant:

void sei_cat(sei_t* to, sei_t* from, int itu_t_t35)
{
    if (!to || !from) {
        return;
    }

    sei_message_t* msg = NULL;
    for (msg = sei_message_head(from); msg; msg = sei_message_next(msg)) {
        if (itu_t_t35 || sei_type_user_data_registered_itu_t_t35 != msg->type) {
            sei_message_append(to, sei_message_copy(msg));
        }
    }
}